

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O2

int __thiscall
icu_63::ResourceBundle::clone
          (ResourceBundle *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ResourceBundle *this_00;
  
  this_00 = (ResourceBundle *)UMemory::operator_new((UMemory *)0x18,(size_t)__fn);
  if (this_00 != (ResourceBundle *)0x0) {
    ResourceBundle(this_00,this);
  }
  return (int)this_00;
}

Assistant:

ResourceBundle *
ResourceBundle::clone() const {
    return new ResourceBundle(*this);
}